

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy_generic.cpp
# Opt level: O2

QList<QNetworkProxy> *
QNetworkProxyFactory::systemProxyForQuery
          (QList<QNetworkProxy> *__return_storage_ptr__,QNetworkProxyQuery *query)

{
  undefined1 auVar1 [12];
  ProxyType type;
  Data *pDVar2;
  QNetworkProxy *pQVar3;
  char16_t *pcVar4;
  char cVar5;
  bool bVar6;
  quint16 qVar7;
  int iVar8;
  QueryType QVar9;
  Data *pDVar10;
  qsizetype qVar11;
  long lVar12;
  QByteArray *rawToken;
  QByteArray *pQVar13;
  long in_FS_OFFSET;
  QLatin1StringView QVar14;
  QLatin1String QVar15;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_e8;
  QNetworkProxy proxy;
  QUrl url;
  QArrayDataPointer<QNetworkProxy> local_b8;
  QArrayDataPointer<QByteArray> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QNetworkProxy *)0x0;
  local_b8.size = 0;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_78);
  QByteArray::trimmed_helper((QByteArray *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  else {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkProxyQuery::peerHostName((QString *)&local_78,query);
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_98);
    pQVar13 = local_98.ptr;
    for (lVar12 = local_98.size * 0x18; lVar12 != 0; lVar12 = lVar12 + -0x18) {
      local_e8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_e8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_108.ptr = (char16_t *)(pQVar13->d).ptr;
      local_108.d = (Data *)(pQVar13->d).size;
      QVar14 = QLatin1String::trimmed((QLatin1String *)&local_108);
      local_e8._0_16_ = QVar14;
      if ((QVar14.m_size == 0) ||
         ((*QVar14.m_data == '*' &&
          (QVar14 = QLatin1String::mid((QLatin1String *)&local_e8,1,-1), local_e8._0_16_ = QVar14,
          QVar14.m_size == 0)))) {
LAB_0021db5b:
        auVar1._8_4_ = 0;
        auVar1._0_8_ = QVar14.m_data;
        auVar1 = auVar1 << 0x40;
      }
      else {
        local_e8._0_16_ = QVar14;
        if (QVar14.m_data[QVar14.m_size + -1] == '.') {
          cVar5 = QString::endsWith((QChar)(char16_t)&local_78,0x2e);
          pDVar10 = local_e8.d;
          if (cVar5 == '\0') {
            pDVar10 = (Data *)((long)&local_e8.d[-1].super_QArrayData.alloc + 7);
            local_e8.d = pDVar10;
          }
          QVar14.m_data = (char *)local_e8.ptr;
          QVar14.m_size = (qsizetype)pDVar10;
          if (pDVar10 == (Data *)0x0) goto LAB_0021db5b;
        }
        auVar1 = QVar14._0_12_;
        if (*QVar14.m_data == '.') {
          local_e8._0_16_ = QLatin1String::mid((QLatin1String *)&local_e8,1,-1);
          auVar1 = local_e8._0_12_;
        }
      }
      QVar15.m_data = auVar1._0_8_;
      QVar15.m_size = (qsizetype)&local_78;
      cVar5 = QString::endsWith(QVar15,auVar1._8_4_);
      if ((cVar5 != '\0') &&
         (((Data *)local_78.size == local_e8.d ||
          (local_78.ptr
           [(long)((long)&(((QArrayData *)local_78.size)->ref_)._q_value.super___atomic_base<int>.
                          _M_i + ~(ulong)local_e8.d)] == L'.')))) {
        QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
        local_78.d = (Data *)0x0;
        local_78.ptr = (char16_t *)0x0;
        local_78.size = 0;
        local_98.d = (Data *)0x0;
        local_98.ptr = (QByteArray *)0x0;
        local_98.size = 0;
        QNetworkProxy::QNetworkProxy
                  ((QNetworkProxy *)&local_e8,NoProxy,(QString *)&local_58,0,(QString *)&local_78,
                   (QString *)&local_98);
        QList<QNetworkProxy>::emplaceBack<QNetworkProxy>
                  ((QList<QNetworkProxy> *)&local_b8,(QNetworkProxy *)&local_e8);
        (__return_storage_ptr__->d).d = local_b8.d;
        (__return_storage_ptr__->d).ptr = local_b8.ptr;
        (__return_storage_ptr__->d).size = local_b8.size;
        if (local_b8.d != (Data *)0x0) {
          LOCK();
          ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        goto LAB_0021e1f4;
      }
      pQVar13 = pQVar13 + 1;
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxyQuery::protocolTag((QString *)&local_58,query);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  local_98.d = (Data *)0x4;
  local_98.ptr = (QByteArray *)0x23dd43;
  bVar6 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_98);
  if (!bVar6) {
    local_98.d = (Data *)0x5;
    local_98.ptr = (QByteArray *)0x23dd27;
    bVar6 = ::operator==((QString *)&local_58,(QLatin1StringView *)&local_98);
    if (!bVar6) {
      local_98.d = (Data *)0x3;
      local_98.ptr = (QByteArray *)0x23ca7a;
      ::operator==((QString *)&local_58,(QLatin1StringView *)&local_98);
    }
  }
  qgetenv((char *)&local_98);
  qVar11 = local_98.size;
  local_78.ptr = (char16_t *)local_98.ptr;
  local_78.d = (Data *)local_98.d;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QByteArray *)0x0;
  local_78.size = local_98.size;
  local_98.size = 0;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
  if ((undefined1 *)qVar11 == (undefined1 *)0x0) {
    qgetenv((char *)&local_98);
    qVar11 = local_78.size;
    pcVar4 = local_78.ptr;
    pDVar10 = local_78.d;
    local_78.d = (Data *)local_98.d;
    local_78.ptr = (char16_t *)local_98.ptr;
    local_98.d = (Data *)pDVar10;
    local_98.ptr = (QByteArray *)pcVar4;
    local_78.size = local_98.size;
    local_98.size = qVar11;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_98);
    if ((undefined1 *)local_78.size == (undefined1 *)0x0) goto LAB_0021e12a;
  }
  url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QString::fromLocal8Bit<void>((QString *)&local_98,(QByteArray *)&local_78);
  QUrl::QUrl(&url,(QString *)&local_98,TolerantMode);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::scheme();
  local_e8.ptr = (char16_t *)"socks5";
  local_e8.d = (Data *)0x6;
  bVar6 = ::operator==((QString *)&local_98,(QLatin1StringView *)&local_e8);
  if (bVar6) {
    proxy.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::host((QLatin1StringView *)&local_e8,&url,0x7f00000);
    iVar8 = QUrl::port((int)&url);
    if (iVar8 == 0) {
      qVar7 = 0x438;
    }
    else {
      qVar7 = QUrl::port((int)&url);
    }
    QUrl::userName(&local_108,&url,0x7f00000);
    QUrl::password(&local_120,&url,0x7f00000);
    type = Socks5Proxy;
LAB_0021e03d:
    QNetworkProxy::QNetworkProxy
              (&proxy,type,(QString *)&local_e8,qVar7,(QString *)&local_108,(QString *)&local_120);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QList<QNetworkProxy>::emplaceBack<QNetworkProxy_const&>
              ((QList<QNetworkProxy> *)&local_b8,&proxy);
LAB_0021e10e:
    QNetworkProxy::~QNetworkProxy(&proxy);
  }
  else {
    local_e8.ptr = (char16_t *)"socks5h";
    local_e8.d = (Data *)0x7;
    bVar6 = ::operator==((QString *)&local_98,(QLatin1StringView *)&local_e8);
    if (bVar6) {
      proxy.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QUrl::host((QLatin1StringView *)&local_e8,&url,0x7f00000);
      iVar8 = QUrl::port((int)&url);
      if (iVar8 == 0) {
        qVar7 = 0x438;
      }
      else {
        qVar7 = QUrl::port((int)&url);
      }
      QUrl::userName(&local_108,&url,0x7f00000);
      QUrl::password(&local_120,&url,0x7f00000);
      QNetworkProxy::QNetworkProxy
                (&proxy,Socks5Proxy,(QString *)&local_e8,qVar7,(QString *)&local_108,
                 (QString *)&local_120);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QNetworkProxy::setCapabilities(&proxy,(Capabilities)0x10);
      QList<QNetworkProxy>::emplaceBack<QNetworkProxy_const&>
                ((QList<QNetworkProxy> *)&local_b8,&proxy);
      goto LAB_0021e10e;
    }
    if ((undefined1 *)local_98.size == (undefined1 *)0x0) {
LAB_0021df9b:
      QVar9 = QNetworkProxyQuery::queryType(query);
      if ((QVar9 != UdpSocket) && (QVar9 = QNetworkProxyQuery::queryType(query), QVar9 != TcpServer)
         ) {
        proxy.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QUrl::host((QLatin1StringView *)&local_e8,&url,0x7f00000);
        iVar8 = QUrl::port((int)&url);
        if (iVar8 == 0) {
          qVar7 = 0x1f90;
        }
        else {
          qVar7 = QUrl::port((int)&url);
        }
        QUrl::userName(&local_108,&url,0x7f00000);
        QUrl::password(&local_120,&url,0x7f00000);
        type = HttpProxy;
        goto LAB_0021e03d;
      }
    }
    else {
      local_e8.ptr = (char16_t *)"http";
      local_e8.d = (Data *)0x4;
      bVar6 = ::operator==((QString *)&local_98,(QLatin1StringView *)&local_e8);
      if (bVar6) goto LAB_0021df9b;
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QUrl::~QUrl(&url);
LAB_0021e12a:
  qVar11 = local_b8.size;
  if (local_b8.size == 0) {
    local_98.size = 0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (QByteArray *)0x0;
    local_e8._0_16_ = ZEXT816(0);
    local_e8.size = 0;
    local_108.d = (Data *)0x0;
    local_108.ptr = (char16_t *)0x0;
    local_108.size = 0;
    QNetworkProxy::QNetworkProxy
              ((QNetworkProxy *)&local_120,NoProxy,(QString *)&local_98,0,(QString *)&local_e8,
               (QString *)&local_108);
    QList<QNetworkProxy>::emplaceBack<QNetworkProxy>
              ((QList<QNetworkProxy> *)&local_b8,(QNetworkProxy *)&local_120);
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_120);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    qVar11 = local_b8.size;
  }
  pQVar3 = local_b8.ptr;
  pDVar2 = local_b8.d;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (QNetworkProxy *)0x0;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = pQVar3;
  local_b8.size = 0;
  (__return_storage_ptr__->d).size = qVar11;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
LAB_0021e1f4:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<QNetworkProxy>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QNetworkProxy> QNetworkProxyFactory::systemProxyForQuery(const QNetworkProxyQuery &query)
{
    QList<QNetworkProxy> proxyList;

    if (ignoreProxyFor(query))
        return proxyList << QNetworkProxy::NoProxy;

    // No need to care about casing here, QUrl lowercases values already
    const QString queryProtocol = query.protocolTag();
    QByteArray proxy_env;

    if (queryProtocol == "http"_L1)
        proxy_env = qgetenv("http_proxy");
    else if (queryProtocol == "https"_L1)
        proxy_env = qgetenv("https_proxy");
    else if (queryProtocol == "ftp"_L1)
        proxy_env = qgetenv("ftp_proxy");
    else
        proxy_env = qgetenv("all_proxy");

    // Fallback to http_proxy is no protocol specific proxy was found
    if (proxy_env.isEmpty())
        proxy_env = qgetenv("http_proxy");

    if (!proxy_env.isEmpty()) {
        QUrl url = QUrl(QString::fromLocal8Bit(proxy_env));
        const QString scheme = url.scheme();
        if (scheme == "socks5"_L1) {
            QNetworkProxy proxy(QNetworkProxy::Socks5Proxy, url.host(),
                    url.port() ? url.port() : 1080, url.userName(), url.password());
            proxyList << proxy;
        } else if (scheme == "socks5h"_L1) {
            QNetworkProxy proxy(QNetworkProxy::Socks5Proxy, url.host(),
                    url.port() ? url.port() : 1080, url.userName(), url.password());
            proxy.setCapabilities(QNetworkProxy::HostNameLookupCapability);
            proxyList << proxy;
        } else if ((scheme.isEmpty() || scheme == "http"_L1)
                  && query.queryType() != QNetworkProxyQuery::UdpSocket
                  && query.queryType() != QNetworkProxyQuery::TcpServer) {
            QNetworkProxy proxy(QNetworkProxy::HttpProxy, url.host(),
                    url.port() ? url.port() : 8080, url.userName(), url.password());
            proxyList << proxy;
        }
    }
    if (proxyList.isEmpty())
        proxyList << QNetworkProxy::NoProxy;

    return proxyList;
}